

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

bool __thiscall
HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
::findPosition(HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
               *this,KeyType *key,u8 *meta,u64 *startPos,u64 *maxPos,u64 *pos)

{
  SolutionEntry *vals;
  _Head_base<0UL,_HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>_*,_false>
  _Var1;
  bool bVar2;
  u64 uVar3;
  uchar *puVar4;
  byte bVar5;
  ulong uVar6;
  
  vals = (key->
         super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
         )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = HighsHashHelpers::vector_hash<HighsGFkSolve::SolutionEntry,_0>
                    (vals,(long)(key->
                                super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)vals >> 3);
  uVar6 = uVar3 >> ((byte)this->numHashShift & 0x3f);
  *startPos = uVar6;
  *maxPos = uVar6 + 0x7f & this->tableSizeMask;
  *meta = (byte)(uVar3 >> ((byte)this->numHashShift & 0x3f)) | 0x80;
  _Var1._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>,_HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>_*,_HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>::OpNewDeleter>
       .
       super__Head_base<0UL,_HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>_*,_false>
       ._M_head_impl;
  uVar6 = *startPos;
  *pos = uVar6;
  puVar4 = (this->metadata)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  while( true ) {
    bVar5 = puVar4[uVar6];
    if (-1 < (char)bVar5) {
      return false;
    }
    if (bVar5 == *meta) {
      bVar2 = HighsHashHelpers::equal<HighsGFkSolve::SolutionEntry,_0>
                        (key,&_Var1._M_head_impl[uVar6].value_);
      if (bVar2) {
        return true;
      }
      uVar6 = *pos;
      puVar4 = (this->metadata)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      bVar5 = puVar4[uVar6];
    }
    if ((ulong)((int)uVar6 - (uint)bVar5 & 0x7f) < (uVar6 - *startPos & this->tableSizeMask)) break;
    uVar6 = uVar6 + 1 & this->tableSizeMask;
    *pos = uVar6;
    if (uVar6 == *maxPos) {
      return false;
    }
  }
  return false;
}

Assistant:

bool findPosition(const KeyType& key, u8& meta, u64& startPos, u64& maxPos,
                    u64& pos) const {
    u64 hash = HighsHashHelpers::hash(key);
    startPos = hash >> numHashShift;
    maxPos = (startPos + maxDistance()) & tableSizeMask;
    meta = toMetadata(hash);

    const Entry* entryArray = entries.get();
    pos = startPos;
    do {
      if (!occupied(metadata[pos])) return false;
      if (metadata[pos] == meta &&
          HighsHashHelpers::equal(key, entryArray[pos].key()))
        return true;

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      if (currentDistance > distanceFromIdealSlot(pos)) return false;

      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    return false;
  }